

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retIncrem.c
# Opt level: O1

int Abc_NtkRetimeIncremental
              (Abc_Ntk_t *pNtk,int nDelayLim,int fForward,int fMinDelay,int fOneStep,int fVerbose)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pObj;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  st__table *psVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  Abc_Ntk_t *local_58;
  Abc_Ntk_t *local_48;
  Vec_Int_t *local_40;
  
  if (pNtk->nObjCounts[7] == 0) {
    iVar5 = 0;
  }
  else {
    iVar1 = pNtk->nObjCounts[8];
    iVar7 = pNtk->vObjs->nSize;
    Abc_NtkOrderCisCos(pNtk);
    if (fMinDelay == 0) {
      iVar5 = -1;
      local_58 = (Abc_Ntk_t *)0x0;
    }
    else {
      iVar5 = 1;
      if (fOneStep == 0) {
        iVar5 = Abc_NtkLevel(pNtk);
        iVar5 = iVar5 * 2;
      }
      local_58 = Abc_NtkDup(pNtk);
      psVar8 = Abc_NtkRetimePrepareLatches(local_58);
      st__free_table(psVar8);
    }
    psVar8 = Abc_NtkRetimePrepareLatches(pNtk);
    Abc_NtkRetimeShareLatches(pNtk,0);
    pVVar2 = pNtk->vBoxes;
    pNtk->vBoxes = (Vec_Ptr_t *)0x0;
    if (fMinDelay == 0) {
      if (fForward == 0) {
        local_40 = Abc_NtkRetimeCollectLatchValues(pNtk);
        local_48 = Abc_NtkRetimeBackwardInitialStart(pNtk);
      }
      else {
        Abc_NtkRetimeTranferToCopy(pNtk);
        local_40 = (Vec_Int_t *)0x0;
        local_48 = (Abc_Ntk_t *)0x0;
      }
      iVar5 = 0;
      do {
        pVVar9 = pNtk->vObjs;
        bVar4 = false;
        if (0 < pVVar9->nSize) {
          lVar10 = 0;
          do {
            pObj = (Abc_Obj_t *)pVVar9->pArray[lVar10];
            if (((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) &&
               (iVar6 = Abc_NtkRetimeNodeIsEnabled(pObj,fForward), iVar6 != 0)) {
              bVar4 = true;
              Abc_NtkRetimeNode(pObj,fForward,1);
              iVar6 = iVar5 + 1;
              bVar3 = 0x270e < iVar5;
              iVar5 = iVar6;
              if (bVar3) {
                printf("Stopped after %d latch moves.\n");
                bVar4 = true;
                break;
              }
            }
            lVar10 = lVar10 + 1;
            pVVar9 = pNtk->vObjs;
          } while (lVar10 < pVVar9->nSize);
        }
      } while ((bVar4) && (iVar5 < 10000));
      if (fForward == 0) {
        Abc_NtkRetimeBackwardInitialFinish(pNtk,local_48,local_40,fVerbose);
        Abc_NtkDelete(local_48);
        if (local_40->pArray != (int *)0x0) {
          free(local_40->pArray);
          local_40->pArray = (int *)0x0;
        }
        if (local_40 != (Vec_Int_t *)0x0) {
          free(local_40);
        }
      }
      else {
        Abc_NtkRetimeTranferFromCopy(pNtk);
      }
    }
    else {
      Abc_NtkRetimeMinDelay(pNtk,local_58,nDelayLim,iVar5,fForward,fVerbose);
    }
    if (fMinDelay != 0) {
      Abc_NtkDelete(local_58);
    }
    iVar5 = 0;
    Abc_NtkRetimeShareLatches(pNtk,0);
    pNtk->vBoxes = pVVar2;
    iVar7 = Abc_NtkRetimeFinalizeLatches(pNtk,psVar8,iVar7);
    st__free_table(psVar8);
    if (iVar7 != 0) {
      iVar5 = Abc_NtkCheck(pNtk);
      if (iVar5 == 0) {
        fwrite("Abc_NtkRetimeForward(): Network check has failed.\n",0x32,1,_stdout);
      }
      iVar5 = iVar1 - pNtk->nObjCounts[8];
    }
  }
  return iVar5;
}

Assistant:

int Abc_NtkRetimeIncremental( Abc_Ntk_t * pNtk, int nDelayLim, int fForward, int fMinDelay, int fOneStep, int fVerbose )
{
    Abc_Ntk_t * pNtkCopy = NULL;
    Vec_Ptr_t * vBoxes;
    st__table * tLatches;
    int nLatches = Abc_NtkLatchNum(pNtk);
    int nIdMaxStart = Abc_NtkObjNumMax(pNtk);
    int RetValue;
    int nIterLimit = -1; // Suppress "might be used uninitialized"
    if ( Abc_NtkNodeNum(pNtk) == 0 )
        return 0;
    // reorder CI/CO/latch inputs
    Abc_NtkOrderCisCos( pNtk );
    if ( fMinDelay ) 
    {
        nIterLimit = fOneStep? 1 : 2 * Abc_NtkLevel(pNtk);
        pNtkCopy = Abc_NtkDup( pNtk );
        tLatches = Abc_NtkRetimePrepareLatches( pNtkCopy );
        st__free_table( tLatches );
    }
    // collect latches and remove CIs/COs
    tLatches = Abc_NtkRetimePrepareLatches( pNtk );
    // share the latches
    Abc_NtkRetimeShareLatches( pNtk, 0 );    
    // save boxes
    vBoxes = pNtk->vBoxes;  pNtk->vBoxes = NULL;
    // perform the retiming
    if ( fMinDelay )
        Abc_NtkRetimeMinDelay( pNtk, pNtkCopy, nDelayLim, nIterLimit, fForward, fVerbose );
    else
        Abc_NtkRetimeOneWay( pNtk, fForward, fVerbose );
    if ( fMinDelay ) 
        Abc_NtkDelete( pNtkCopy );
    // share the latches
    Abc_NtkRetimeShareLatches( pNtk, 0 );    
    // restore boxes
    pNtk->vBoxes = vBoxes;
    // finalize the latches
    RetValue = Abc_NtkRetimeFinalizeLatches( pNtk, tLatches, nIdMaxStart );
    st__free_table( tLatches );
    if ( RetValue == 0 )
        return 0;
    // fix the COs
//    Abc_NtkLogicMakeSimpleCos( pNtk, 0 );
    // check for correctness
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkRetimeForward(): Network check has failed.\n" );
    // return the number of latches saved
    return nLatches - Abc_NtkLatchNum(pNtk);
}